

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pure.cpp
# Opt level: O0

string * fs_join_abi_cxx11_(string *__return_storage_ptr__,string_view path,string_view other)

{
  string_view in;
  string_view in_00;
  string_view in_01;
  string_view in_02;
  bool bVar1;
  path local_140;
  path local_118;
  path local_f0;
  size_t local_b8;
  size_t sStack_b0;
  undefined1 local_a8 [8];
  string o;
  undefined1 local_70 [8];
  string p;
  undefined1 auStack_30 [8];
  string_view other_local;
  string_view path_local;
  
  other_local._M_len = (size_t)other._M_str;
  auStack_30 = (undefined1  [8])other._M_len;
  other_local._M_str = (char *)path._M_len;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&other_local._M_str);
  if ((bVar1) &&
     (bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_30), bVar1)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&other_local._M_str);
    if (bVar1) {
      in_02._M_str = (char *)other_local._M_len;
      in_02._M_len = (size_t)auStack_30;
      fs_drop_slash_abi_cxx11_(__return_storage_ptr__,in_02);
    }
    else {
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                        ((basic_string_view<char,_std::char_traits<char>_> *)auStack_30);
      if (bVar1) {
        p.field_2._8_8_ = other_local._M_str;
        in_01._M_str = path._M_str;
        in_01._M_len = (size_t)other_local._M_str;
        fs_drop_slash_abi_cxx11_(__return_storage_ptr__,in_01);
      }
      else {
        o.field_2._8_8_ = other_local._M_str;
        in_00._M_str = path._M_str;
        in_00._M_len = (size_t)other_local._M_str;
        fs_drop_slash_abi_cxx11_((string *)local_70,in_00);
        local_b8 = (size_t)auStack_30;
        sStack_b0 = other_local._M_len;
        in._M_str = (char *)other_local._M_len;
        in._M_len = (size_t)auStack_30;
        fs_drop_slash_abi_cxx11_((string *)local_a8,in);
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_118,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                   auto_format);
        std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
                  (&local_140,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                   auto_format);
        std::filesystem::__cxx11::operator/(&local_f0,&local_118,&local_140);
        std::filesystem::__cxx11::path::generic_string(__return_storage_ptr__,&local_f0);
        std::filesystem::__cxx11::path::~path(&local_f0);
        std::filesystem::__cxx11::path::~path(&local_140);
        std::filesystem::__cxx11::path::~path(&local_118);
        std::__cxx11::string::~string((string *)local_a8);
        std::__cxx11::string::~string((string *)local_70);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fs_join(std::string_view path, std::string_view other)
{
  // does not normalize to preserve possible symlinks
  if(path.empty() && other.empty())
    return {};
  if(path.empty())
    return fs_drop_slash(other);
  if(other.empty())
    return fs_drop_slash(path);

  std::string p = fs_drop_slash(path);
  const std::string o = fs_drop_slash(other);

#ifdef HAVE_CXX_FILESYSTEM
  return (std::filesystem::path(p) / o).generic_string();
#else
  if (o.front() == '/' || (fs_is_windows() && fs_is_absolute(o)))
    return o;

  p.push_back('/');

  return p.append(o);
#endif
}